

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O3

void sdefl_put(uchar **dst,sdefl *s,int code,int bitcnt)

{
  int iVar1;
  uchar *puVar2;
  
  s->bits = s->bits | code << ((byte)s->bitcnt & 0x1f);
  iVar1 = bitcnt + s->bitcnt;
  s->bitcnt = iVar1;
  if (7 < iVar1) {
    puVar2 = *dst;
    do {
      *puVar2 = (uchar)s->bits;
      s->bits = s->bits >> 8;
      s->bitcnt = s->bitcnt + -8;
      puVar2 = *dst + 1;
      *dst = puVar2;
    } while (7 < s->bitcnt);
  }
  return;
}

Assistant:

static void
sdefl_put(unsigned char **dst, struct sdefl *s, int code, int bitcnt) {
  s->bits |= (code << s->bitcnt);
  s->bitcnt += bitcnt;
  while (s->bitcnt >= 8) {
    unsigned char *tar = *dst;
    *tar = (unsigned char)(s->bits & 0xFF);
    s->bits >>= 8;
    s->bitcnt -= 8;
    *dst = *dst + 1;
  }
}